

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O0

void M3x3_Transpose(double (*m) [3])

{
  double dVar1;
  double temp;
  int j;
  int i;
  double (*m_local) [3];
  
  for (i = 0; j = i, i < 2; i = i + 1) {
    while (j = j + 1, j < 3) {
      dVar1 = m[i][j];
      m[i][j] = m[j][i];
      m[j][i] = dVar1;
    }
  }
  return;
}

Assistant:

void M3x3_Transpose(double m[3][3])
{
   int i, j;
   double temp;

    for (i=0 ; i<2 ; i++)
    {
        for (j=i+1 ; j<3 ; j++)
        {
            temp   = m[i][j];
            m[i][j] = m[j][i];
            m[j][i] = temp;
        }
    }
}